

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O2

QWindow * __thiscall QAccessibleWidget::window(QAccessibleWidget *this)

{
  QWidget *pQVar1;
  QWindow *pQVar2;
  
  pQVar1 = widget(this);
  pQVar2 = QWidget::windowHandle(pQVar1);
  if (pQVar2 == (QWindow *)0x0) {
    pQVar1 = QWidget::nativeParentWidget(pQVar1);
    if (pQVar1 != (QWidget *)0x0) {
      pQVar2 = QWidget::windowHandle(pQVar1);
      return pQVar2;
    }
    pQVar2 = (QWindow *)0x0;
  }
  return pQVar2;
}

Assistant:

QWindow *QAccessibleWidget::window() const
{
    const QWidget *w = widget();
    Q_ASSERT(w);
    QWindow *result = w->windowHandle();
    if (!result) {
        if (const QWidget *nativeParent = w->nativeParentWidget())
            result = nativeParent->windowHandle();
    }
    return result;
}